

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_uuid.c
# Opt level: O1

ssize_t read_all(int fd,char *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = 0;
  memset(buf,0,count);
  bVar5 = count == 0;
  if (!bVar5) {
    uVar4 = 0;
    do {
      uVar3 = 0;
      while (sVar1 = read(fd,buf,count), sVar1 < 1) {
        piVar2 = __errno_location();
        if (((*piVar2 != 0xb) && (sVar1 != 0 && *piVar2 != 4)) || (4 < uVar3)) {
          return uVar4 | -(ulong)(uVar4 == 0);
        }
        uVar3 = uVar3 + 1;
        if (bVar5) {
          return uVar4;
        }
      }
      buf = buf + sVar1;
      uVar4 = uVar4 + sVar1;
      count = count - sVar1;
      bVar5 = count == 0;
    } while (!bVar5);
  }
  return uVar4;
}

Assistant:

static ssize_t read_all(int fd, char *buf, size_t count)
{
	ssize_t ret;
	ssize_t c = 0;
	int tries = 0;

	memset(buf, 0, count);
	while (count > 0) {
		ret = read(fd, buf, count);
		if (ret <= 0) {
			if ((errno == EAGAIN || errno == EINTR || ret == 0) &&
			    (tries++ < 5))
				continue;
			return c ? c : -1;
		}
		if (ret > 0)
			tries = 0;
		count -= ret;
		buf += ret;
		c += ret;
	}
	return c;
}